

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Own<capnp::compiler::NodeTranslator::BrandScope> __thiscall
capnp::compiler::NodeTranslator::BrandScope::pop(BrandScope *this,uint64_t newLeafId)

{
  BrandScope *pBVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  Refcounted *refcounted;
  BrandScope *in_RDX;
  BrandScope *extraout_RDX;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar4;
  
  pBVar1 = *(BrandScope **)(newLeafId + 0x28);
  do {
    if (pBVar1 == in_RDX) {
      *(int *)(newLeafId + 8) = *(int *)(newLeafId + 8) + 1;
LAB_001d9f94:
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)newLeafId;
      *(uint64_t *)&(this->super_Refcounted).refcount = newLeafId;
      OVar4.ptr = in_RDX;
      OVar4.disposer = (Disposer *)this;
      return OVar4;
    }
    pp_Var2 = *(_func_int ***)(newLeafId + 0x20);
    if (pp_Var2 == (_func_int **)0x0) {
      p_Var3 = *(_func_int **)(newLeafId + 0x10);
      newLeafId = (uint64_t)operator_new(0x50);
      *(undefined ***)newLeafId = &PTR_disposeImpl_002be380;
      *(_func_int **)(newLeafId + 0x10) = p_Var3;
      *(_func_int **)(newLeafId + 0x18) = (_func_int *)0x0;
      *(_func_int **)(newLeafId + 0x20) = (_func_int *)0x0;
      *(BrandScope **)(newLeafId + 0x28) = in_RDX;
      *(undefined4 *)(newLeafId + 0x30) = 0;
      *(undefined1 *)(newLeafId + 0x34) = 0;
      *(_func_int **)(newLeafId + 0x38) = (_func_int *)0x0;
      *(_func_int **)(newLeafId + 0x40) = (_func_int *)0x0;
      *(_func_int **)(newLeafId + 0x48) = (_func_int *)0x0;
      *(undefined4 *)(newLeafId + 8) = 1;
      in_RDX = extraout_RDX;
      goto LAB_001d9f94;
    }
    pBVar1 = (BrandScope *)pp_Var2[5];
    newLeafId = (uint64_t)pp_Var2;
  } while( true );
}

Assistant:

kj::Own<BrandScope> pop(uint64_t newLeafId) {
    if (leafId == newLeafId) {
      return kj::addRef(*this);
    }
    KJ_IF_MAYBE(p, parent) {
      return (*p)->pop(newLeafId);
    } else {
      // Looks like we're moving into a whole top-level scope.
      return kj::refcounted<BrandScope>(errorReporter, newLeafId);
    }